

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageClass(StackInterpreter *this)

{
  size_t sVar1;
  VMContext *this_00;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar2;
  uint8_t *puVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar4;
  
  sVar1 = this->pc;
  this->pc = sVar1 + 1;
  this->nextOpcode =
       (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                              super_SequenceableCollection.super_Collection.super_Object.
                              super_ProtoObject.object_header_ + sVar1);
  this_00 = this->context;
  paVar2 = (anon_union_8_4_0eb573b0_for_Oop_0 *)(this->stack->stackFrame).stackPointer;
  aVar4 = *paVar2;
  (this->stack->stackFrame).stackPointer = (uint8_t *)(paVar2 + 1);
  aVar4.pointer = (uint8_t *)VMContext::getClassFromOop(this_00,aVar4.pointer);
  puVar3 = (this->stack->stackFrame).stackPointer;
  (this->stack->stackFrame).stackPointer = puVar3 + -8;
  *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar3 + -8) = aVar4;
  return;
}

Assistant:

void interpretSpecialMessageClass()
    {
        fetchNextInstructionOpcode();
        Oop clazz = context->getClassFromOop(popOop());
        pushOop(clazz);
    }